

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O1

void google::protobuf::compiler::objectivec::anon_unknown_0::
     CollectMinimalFileDepsContainingExtensionsWorker
               (FileDescriptor *file,
               vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *files,set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      *files_visited)

{
  _Rb_tree_header *p_Var1;
  pointer *pppFVar2;
  iterator __position;
  bool bVar3;
  FileDescriptor *pFVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  int iVar7;
  FileDescriptor *local_28;
  
  p_Var1 = &(files_visited->_M_t)._M_impl.super__Rb_tree_header;
  p_Var6 = (files_visited->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0;
      p_Var6 = (&p_Var6->_M_left)[*(FileDescriptor **)(p_Var6 + 1) < file]) {
    if (*(FileDescriptor **)(p_Var6 + 1) >= file) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
     (p_Var6 = p_Var5, file < *(FileDescriptor **)(p_Var5 + 1))) {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    local_28 = file;
    std::
    _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
    ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
              ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                *)files_visited,&local_28);
    pFVar4 = local_28;
    bVar3 = FileContainsExtensions(local_28);
    if (bVar3) {
      __position._M_current =
           (files->
           super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (files->
          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FileDescriptor_const*const&>
                  ((vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
                    *)files,__position,&local_28);
      }
      else {
        *__position._M_current = pFVar4;
        pppFVar2 = &(files->
                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppFVar2 = *pppFVar2 + 1;
      }
      if (0 < *(int *)(local_28 + 0x20)) {
        iVar7 = 0;
        do {
          pFVar4 = FileDescriptor::dependency(local_28,iVar7);
          PruneFileAndDepsMarkingAsVisited(pFVar4,files,files_visited);
          iVar7 = iVar7 + 1;
        } while (iVar7 < *(int *)(local_28 + 0x20));
      }
    }
    else if (0 < *(int *)(local_28 + 0x20)) {
      iVar7 = 0;
      do {
        pFVar4 = FileDescriptor::dependency(local_28,iVar7);
        CollectMinimalFileDepsContainingExtensionsWorker(pFVar4,files,files_visited);
        iVar7 = iVar7 + 1;
      } while (iVar7 < *(int *)(local_28 + 0x20));
    }
  }
  return;
}

Assistant:

void CollectMinimalFileDepsContainingExtensionsWorker(
    const FileDescriptor* file,
    std::vector<const FileDescriptor*>* files,
    std::set<const FileDescriptor*>* files_visited) {
  if (files_visited->find(file) != files_visited->end()) {
    return;
  }
  files_visited->insert(file);

  if (FileContainsExtensions(file)) {
    files->push_back(file);
    for (int i = 0; i < file->dependency_count(); i++) {
      const FileDescriptor* dep = file->dependency(i);
      PruneFileAndDepsMarkingAsVisited(dep, files, files_visited);
    }
  } else {
    for (int i = 0; i < file->dependency_count(); i++) {
      const FileDescriptor* dep = file->dependency(i);
      CollectMinimalFileDepsContainingExtensionsWorker(dep, files,
                                                       files_visited);
    }
  }
}